

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_model_component.cpp
# Opt level: O1

Type __thiscall ON_ModelComponentTypeIterator::PreviousType(ON_ModelComponentTypeIterator *this)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  
  iVar1 = this->m_type_count;
  if ((0 < iVar1) &&
     ((iVar2 = this->m_current_index, iVar4 = iVar1, iVar2 == -0x7fffffff ||
      (iVar4 = iVar2, -1 < iVar2)))) {
    this->m_current_index = iVar4 + -1;
  }
  uVar3 = this->m_current_index;
  if ((int)uVar3 < iVar1 && -1 < (int)uVar3) {
    return this->m_types[uVar3];
  }
  return Unset;
}

Assistant:

ON_ModelComponent::Type ON_ModelComponentTypeIterator::PreviousType()
{
  if (m_type_count > 0)
  {
    if (ON_UNSET_INT_INDEX == m_current_index)
      m_current_index = m_type_count-1;
    else if (m_current_index >= 0)
      m_current_index--;
  }
  return CurrentType();
}